

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjDecompress2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                 int pitch,int height,int pixelFormat,int flags)

{
  j_decompress_ptr cinfo;
  undefined1 auVar1 [16];
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  code **ppcVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  code *local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  tjhandle local_38;
  long lVar14;
  
  if (handle == (tjhandle)0x0) {
    puVar4 = (undefined8 *)__tls_get_addr(&PTR_0019ef20);
    *(undefined8 *)((long)puVar4 + 7) = 0x656c646e616820;
    *puVar4 = 0x2064696c61766e49;
    return -1;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecompress2(): Instance has not been initialized for decompression",0x45);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar3 = (void *)__tls_get_addr(&PTR_0019ef20);
    memcpy(pvVar3,"tjDecompress2(): Instance has not been initialized for decompression",0x45);
  }
  else {
    if ((((pixelFormat < 0xc) && (jpegBuf != (uchar *)0x0)) && (jpegSize != 0)) &&
       ((dstBuf != (uchar *)0x0 && (-1 < (pitch | width | height | pixelFormat))))) {
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar8 = "JSIMD_FORCESSE=1";
          goto LAB_00138fe3;
        }
        if ((flags & 0x20U) != 0) {
          pcVar8 = "JSIMD_FORCESSE2=1";
          goto LAB_00138fe3;
        }
      }
      else {
        pcVar8 = "JSIMD_FORCEMMX=1";
LAB_00138fe3:
        putenv(pcVar8);
      }
      if ((short)flags < 0) {
        ppcVar5 = &local_58;
        local_50 = (undefined1  [16])0x0;
        local_40 = 0;
        local_58 = my_progress_monitor;
        local_38 = handle;
      }
      else {
        ppcVar5 = (code **)0x0;
      }
      *(code ***)((long)handle + 0x218) = ppcVar5;
      iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar2 == 0) {
        jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
        jpeg_read_header(cinfo,1);
        *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[pixelFormat];
        if (((uint)flags >> 0xb & 1) != 0) {
          *(undefined4 *)((long)handle + 0x268) = 1;
        }
        if (((uint)flags >> 8 & 1) != 0) {
          *(undefined4 *)((long)handle + 0x26c) = 0;
        }
        if (width == 0) {
          width = *(int *)((long)handle + 0x238);
        }
        if (height == 0) {
          height = *(int *)((long)handle + 0x23c);
        }
        lVar6 = 0;
        do {
          iVar2 = sf[lVar6].denom;
          if (((sf[lVar6].num * *(int *)((long)handle + 0x238) + iVar2 + -1) / iVar2 <= width) &&
             ((sf[lVar6].num * *(int *)((long)handle + 0x23c) + iVar2 + -1) / iVar2 <= height)) {
            *(tjscalingfactor *)((long)handle + 0x24c) = sf[lVar6];
            jpeg_start_decompress(cinfo);
            if (pitch == 0) {
              pitch = tjPixelSize[pixelFormat] * *(int *)((long)handle + 0x290);
            }
            pvVar3 = malloc((ulong)*(uint *)((long)handle + 0x294) << 3);
            if (pvVar3 == (void *)0x0) {
              builtin_strncpy((char *)((long)handle + 0x623),"ocation ",8);
              builtin_strncpy((char *)((long)handle + 0x62b),"failure",8);
              builtin_strncpy((char *)((long)handle + 0x618)," Memory ",8);
              builtin_strncpy((char *)((long)handle + 0x620),"allocati",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
              builtin_strncpy((char *)((long)handle + 0x610),"ress2():",8);
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              pcVar8 = (char *)__tls_get_addr(&PTR_0019ef20);
              builtin_strncpy(pcVar8,"tjDecompress2(): Memory allocation failure",0x2b);
              goto LAB_0013916b;
            }
            iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
            auVar1 = _DAT_00158050;
            if (iVar2 == 0) {
              uVar7 = *(uint *)((long)handle + 0x294);
              if (0 < (long)(int)uVar7) {
                lVar6 = (long)(int)uVar7 + -1;
                auVar10._8_4_ = (int)lVar6;
                auVar10._0_8_ = lVar6;
                auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
                auVar9._0_8_ = (long)pitch;
                auVar9._8_4_ = pitch;
                auVar9._12_4_ = pitch >> 0x1f;
                uVar11 = 0;
                uVar12 = 1;
                lVar6 = 0;
                auVar10 = auVar10 ^ _DAT_00158050;
                auVar13 = _DAT_00158000;
                do {
                  auVar15 = auVar13;
                  if ((flags & 2U) != 0) {
                    auVar15._0_4_ = (uVar11 ^ 0xffffffff) + uVar7;
                    auVar15._4_4_ = 0;
                    auVar15._8_4_ = (uVar12 ^ 0xffffffff) + uVar7;
                    auVar15._12_4_ = 0;
                  }
                  auVar16 = auVar13 ^ auVar1;
                  uVar17 = auVar15._8_8_;
                  if ((bool)(~(auVar16._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar16._0_4_ ||
                              auVar10._4_4_ < auVar16._4_4_) & 1)) {
                    *(uchar **)((long)pvVar3 + lVar6) =
                         dstBuf + (ulong)auVar15._0_4_ * (ulong)(uint)pitch +
                                  ((auVar15._0_8_ >> 0x20) * (ulong)(uint)pitch +
                                   (ulong)auVar15._0_4_ * (ulong)(uint)(pitch >> 0x1f) << 0x20);
                  }
                  if ((auVar16._12_4_ != auVar10._12_4_ || auVar16._8_4_ <= auVar10._8_4_) &&
                      auVar16._12_4_ <= auVar10._12_4_) {
                    *(uchar **)((long)pvVar3 + lVar6 + 8) =
                         dstBuf + (uVar17 & 0xffffffff) * (ulong)(uint)pitch +
                                  ((uVar17 >> 0x20) * (ulong)(uint)pitch +
                                   (uVar17 & 0xffffffff) * (auVar9._8_8_ >> 0x20) << 0x20);
                  }
                  lVar14 = auVar13._8_8_;
                  auVar13._0_8_ = auVar13._0_8_ + 2;
                  auVar13._8_8_ = lVar14 + 2;
                  uVar11 = uVar11 + 2;
                  uVar12 = uVar12 + 2;
                  lVar6 = lVar6 + 0x10;
                } while ((ulong)(uVar7 + 1 >> 1) << 4 != lVar6);
              }
              uVar11 = *(uint *)((long)handle + 0x2b0);
              if (uVar11 < uVar7) {
                do {
                  jpeg_read_scanlines(cinfo,(JSAMPARRAY)((long)pvVar3 + (ulong)uVar11 * 8),
                                      uVar7 - uVar11);
                  uVar7 = *(uint *)((long)handle + 0x294);
                  uVar11 = *(uint *)((long)handle + 0x2b0);
                } while (uVar11 < uVar7);
              }
              jpeg_finish_decompress(cinfo);
              uVar7 = 0;
              goto LAB_00138f90;
            }
            goto LAB_00139170;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x10);
        memcpy((void *)((long)handle + 0x608),
               "tjDecompress2(): Could not scale down to desired image dimensions",0x42);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pvVar3 = (void *)__tls_get_addr(&PTR_0019ef20);
        memcpy(pvVar3,"tjDecompress2(): Could not scale down to desired image dimensions",0x42);
LAB_0013916b:
        pvVar3 = (void *)0x0;
LAB_00139170:
        uVar7 = 0xffffffff;
      }
      else {
        pvVar3 = (void *)0x0;
        uVar7 = 0xffffffff;
      }
      goto LAB_00138f90;
    }
    builtin_strncpy((char *)((long)handle + 0x618)," Invalid",8);
    builtin_strncpy((char *)((long)handle + 0x620)," argumen",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ress2():",8);
    *(undefined2 *)((long)handle + 0x628) = 0x74;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar8 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar8,"tjDecompress2(): Invalid argument",0x22);
  }
  uVar7 = 0xffffffff;
  pvVar3 = (void *)0x0;
LAB_00138f90:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(pvVar3);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar7;
}

Assistant:

DLLEXPORT int tjDecompress2(tjhandle handle, const unsigned char *jpegBuf,
                            unsigned long jpegSize, unsigned char *dstBuf,
                            int width, int pitch, int height, int pixelFormat,
                            int flags)
{
  JSAMPROW *row_pointer = NULL;
  int i, retval = 0, jpegwidth, jpegheight, scaledw, scaledh;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompress2(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pitch < 0 || height < 0 || pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecompress2(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompress2(): Could not scale down to desired image dimensions");
  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;

  jpeg_start_decompress(dinfo);
  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer =
       (JSAMPROW *)malloc(sizeof(JSAMPROW) * dinfo->output_height)) == NULL)
    THROW("tjDecompress2(): Memory allocation failure");
  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }
  for (i = 0; i < (int)dinfo->output_height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(dinfo->output_height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  while (dinfo->output_scanline < dinfo->output_height)
    jpeg_read_scanlines(dinfo, &row_pointer[dinfo->output_scanline],
                        dinfo->output_height - dinfo->output_scanline);
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}